

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyIntegerAnyOf
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  bool bVar1;
  qpTestResult qVar2;
  int *piVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1d0;
  int local_4c;
  ulong uStack_48;
  GLint expectedGLState;
  size_t ndx;
  StateQueryMemoryWriteGuard<int> state;
  size_t referencesLength_local;
  GLint *references_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  state._4_8_ = referencesLength;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)((long)&ndx + 4));
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)((long)&ndx + 4));
  glu::CallLogWrapper::glGetIntegerv(&(this->super_StateVerifier).super_CallLogWrapper,name,piVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)((long)&ndx + 4),testCtx);
  if (bVar1) {
    for (uStack_48 = 0; uStack_48 < (ulong)state._4_8_; uStack_48 = uStack_48 + 1) {
      local_4c = references[uStack_48];
      piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)((long)&ndx + 4));
      if (*piVar3 == local_4c) {
        return;
      }
    }
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [15])"// ERROR: got ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(StateQueryMemoryWriteGuard<int> *)((long)&ndx + 4));
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLint expectedGLState = references[ndx];

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << state << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
}